

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

double __thiscall Emitter::findFlowRate(Emitter *this,double h,double *dqdh)

{
  double dVar1;
  double q;
  double a;
  double *dqdh_local;
  double h_local;
  Emitter *this_local;
  
  *dqdh = 0.0;
  if (0.0 < h) {
    q = this->flowCoeff;
    if (this->timePattern != (Pattern *)0x0) {
      dVar1 = Pattern::currentFactor(this->timePattern);
      q = dVar1 * q;
    }
    dVar1 = pow(h,this->expon);
    this_local = (Emitter *)(q * dVar1);
    *dqdh = (this->expon * (double)this_local) / h;
  }
  else {
    this_local = (Emitter *)0x0;
  }
  return (double)this_local;
}

Assistant:

double Emitter::findFlowRate(double h, double& dqdh)
{
    dqdh = 0.0;
    if ( h <= 0.0 ) return 0.0;
    double a = flowCoeff;
    if (timePattern) a *= timePattern->currentFactor();
    double q = a * pow(h, expon);
    dqdh = expon * q / h;
    return q;
}